

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  undefined1 auVar1 [13];
  PatchList l;
  Frag FVar2;
  uint32_t p;
  Inst *pIVar3;
  Frag FVar4;
  PatchList local_98;
  PatchList pl;
  uint32_t local_88;
  bool bStack_84;
  uint32_t uStack_78;
  int id;
  uint32_t local_70;
  bool bStack_6c;
  undefined3 uStack_3b;
  bool nongreedy_local;
  Compiler *this_local;
  Frag a_local;
  uint32_t local_10;
  undefined4 uStack_c;
  
  this_local._0_4_ = a.begin;
  this_local._4_4_ = a.end.head;
  a_local.begin = a.end.tail;
  a_local.end.head = a._12_4_;
  if (((undefined1  [16])a & (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
    p = AllocInst(this,1);
    if ((int)p < 0) {
      FVar4 = NoMatch(this);
      pl = FVar4._0_8_;
      a_local._8_8_ = pl;
      local_88 = FVar4.end.tail;
      local_10 = local_88;
      bStack_84 = FVar4.nullable;
      uStack_c = CONCAT31(uStack_c._1_3_,bStack_84);
    }
    else {
      if (nongreedy) {
        pIVar3 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,p);
        Prog::Inst::InitAlt(pIVar3,0,(uint32_t)this_local);
        local_98 = PatchList::Mk(p << 1);
      }
      else {
        pIVar3 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,p);
        Prog::Inst::InitAlt(pIVar3,(uint32_t)this_local,0);
        local_98 = PatchList::Mk(p << 1 | 1);
      }
      pIVar3 = PODArray<re2::Prog::Inst>::data(&this->inst_);
      l.tail = a_local.begin;
      l.head = this_local._4_4_;
      PatchList::Patch(pIVar3,l,p);
      Frag::Frag((Frag *)&a_local.end.tail,p,local_98,true);
    }
  }
  else {
    FVar4 = Plus(this,a,nongreedy);
    auVar1 = FVar4._0_13_;
    FVar4._13_3_ = uStack_3b;
    FVar4.begin = auVar1._0_4_;
    FVar4.end.head = (int)auVar1._4_8_;
    FVar4.end.tail = (int)((ulong)auVar1._4_8_ >> 0x20);
    FVar4.nullable = (bool)auVar1[0xc];
    FVar4 = Quest(this,FVar4,nongreedy);
    _uStack_78 = FVar4._0_8_;
    a_local.end.tail = uStack_78;
    a_local.nullable = id._0_1_;
    a_local._13_3_ = id._1_3_;
    local_70 = FVar4.end.tail;
    local_10 = local_70;
    bStack_6c = FVar4.nullable;
    uStack_c = CONCAT31(uStack_c._1_3_,bStack_6c);
  }
  FVar2.end.tail = local_10;
  FVar2._0_8_ = a_local._8_8_;
  FVar2._12_4_ = uStack_c;
  return FVar2;
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  // When the subexpression is nullable, one Alt isn't enough to guarantee
  // correct priority ordering within the transitive closure. The simplest
  // solution is to handle it as (a+)? instead, which adds the second Alt.
  if (a.nullable)
    return Quest(Plus(a, nongreedy), nongreedy);

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(id, pl, true);
}